

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_buffer.h
# Opt level: O1

void __thiscall
PenguinV_Image::ImageTemplate<unsigned_int>::resize
          (ImageTemplate<unsigned_int> *this,uint32_t width_,uint32_t height_)

{
  byte bVar1;
  uint32_t uVar2;
  uint uVar3;
  FunctionFacade *data;
  _func_uint_ptr_unsigned_long *p_Var4;
  uint *puVar5;
  
  if ((height_ != 0 && width_ != 0) && ((this->_width != width_ || (this->_height != height_)))) {
    clear(this);
    this->_width = width_;
    this->_height = height_;
    uVar3 = this->_colorCount * width_;
    this->_rowSize = uVar3;
    bVar1 = this->_alignment;
    if (uVar3 % (uint)bVar1 != 0) {
      this->_rowSize = (uVar3 / bVar1 + 1) * (uint)bVar1;
    }
    uVar2 = this->_rowSize;
    data = FunctionFacade::instance();
    p_Var4 = __PenguinV_Image__ImageTemplate<unsigned_int>__FunctionFacade___getFunction<unsigned_int*(*)(unsigned_long)>_std__vector<unsigned_int*(*)(unsigned_long),std::allocator<unsigned_int*(*)(unsigned_long)>>const__unsigned_char_const_
                       (data,&data->_allocate,this->_type);
    puVar5 = (*p_Var4)((long)height_ * (long)uVar2);
    this->_data = puVar5;
  }
  return;
}

Assistant:

void resize( uint32_t width_, uint32_t height_ )
        {
            if( width_ > 0 && height_ > 0 && (width_ != _width || height_ != _height) ) {
                clear();

                _width  = width_;
                _height = height_;

                _rowSize = width() * colorCount();
                if( _rowSize % alignment() != 0 )
                    _rowSize = (_rowSize / alignment() + 1) * alignment();

                _data = _allocate( _height * _rowSize );
            }
        }